

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry.cpp
# Opt level: O0

bool __thiscall rw::Material::streamWrite(Material *this,Stream *stream)

{
  uint32 size;
  int iVar1;
  float32 local_34;
  float32 local_30;
  float32 surfaceProps [3];
  MatStreamData buf;
  Stream *stream_local;
  Material *this_local;
  
  size = streamGetSize(this);
  writeChunkHeader(stream,7,size);
  iVar1 = 0;
  if (0x303ff < version) {
    iVar1 = 0xc;
  }
  writeChunkHeader(stream,1,iVar1 + 0x10);
  surfaceProps[2] = *(float32 *)&this->color;
  surfaceProps[1] = 0.0;
  memLittle32(surfaceProps + 1,0x10);
  surfaceProps[2] = *(float32 *)&this->color;
  (*stream->_vptr_Stream[3])(stream,surfaceProps + 1,0x10);
  if (0x303ff < version) {
    local_34 = (this->surfaceProps).ambient;
    local_30 = (this->surfaceProps).specular;
    surfaceProps[0] = (this->surfaceProps).diffuse;
    Stream::write32(stream,&local_34,0xc);
  }
  if (this->texture != (Texture *)0x0) {
    Texture::streamWrite(this->texture,stream);
  }
  PluginList::streamWrite((PluginList *)&s_plglist,stream,this);
  return true;
}

Assistant:

bool
Material::streamWrite(Stream *stream)
{
	MatStreamData buf;

	writeChunkHeader(stream, ID_MATERIAL, this->streamGetSize());
	writeChunkHeader(stream, ID_STRUCT, sizeof(MatStreamData)
		+ (rw::version >= 0x30400 ? 12 : 0));

	buf.color = this->color;
	buf.flags = 0;
	buf.unused = 0;
	buf.textured = this->texture != nil;
	memLittle32(&buf, sizeof(buf));
	buf.color = this->color;
	stream->write8(&buf, sizeof(buf));

	if(rw::version >= 0x30400){
		float32 surfaceProps[3];
		surfaceProps[0] = this->surfaceProps.ambient;
		surfaceProps[1] = this->surfaceProps.specular;
		surfaceProps[2] = this->surfaceProps.diffuse;
		stream->write32(surfaceProps, sizeof(surfaceProps));
	}

	if(this->texture)
		this->texture->streamWrite(stream);

	s_plglist.streamWrite(stream, this);
	return true;
}